

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::CompletePropertyDescriptor
               (PropertyDescriptor *resultDescriptor,PropertyDescriptor *likeDescriptor,
               ScriptContext *requestContext)

{
  byte bVar1;
  bool bVar2;
  Var pvVar3;
  byte bVar4;
  
  if (likeDescriptor == (PropertyDescriptor *)0x0) {
    likeDescriptor =
         &((requestContext->super_ScriptContextBase).javascriptLibrary)->defaultPropertyDescriptor;
  }
  bVar1 = resultDescriptor->writableSpecified;
  if (resultDescriptor->valueSpecified == false && (Type)bVar1 == false) {
    bVar4 = resultDescriptor->setterSpecified;
    if ((Type)bVar4 != false || resultDescriptor->getterSpecified != false) {
      if (resultDescriptor->getterSpecified == false) {
        pvVar3 = PropertyDescriptor::GetGetter(likeDescriptor);
        PropertyDescriptor::SetGetter(resultDescriptor,pvVar3);
        bVar4 = resultDescriptor->setterSpecified;
      }
      if ((bVar4 & 1) == 0) {
        pvVar3 = PropertyDescriptor::GetSetter(likeDescriptor);
        PropertyDescriptor::SetSetter(resultDescriptor,pvVar3);
      }
      goto LAB_00abd5b2;
    }
  }
  if (resultDescriptor->valueSpecified == false) {
    PropertyDescriptor::SetValue(resultDescriptor,(likeDescriptor->Value).ptr);
    bVar1 = resultDescriptor->writableSpecified;
  }
  if ((bVar1 & 1) == 0) {
    bVar2 = PropertyDescriptor::IsWritable(likeDescriptor);
    PropertyDescriptor::SetWritable(resultDescriptor,bVar2);
  }
LAB_00abd5b2:
  if (resultDescriptor->enumerableSpecified == false) {
    bVar2 = PropertyDescriptor::IsEnumerable(likeDescriptor);
    PropertyDescriptor::SetEnumerable(resultDescriptor,bVar2);
  }
  if (resultDescriptor->configurableSpecified != false) {
    return;
  }
  bVar2 = PropertyDescriptor::IsConfigurable(likeDescriptor);
  PropertyDescriptor::SetConfigurable(resultDescriptor,bVar2);
  return;
}

Assistant:

void JavascriptOperators::CompletePropertyDescriptor(PropertyDescriptor* resultDescriptor, PropertyDescriptor* likeDescriptor, ScriptContext* requestContext)
    {
        const PropertyDescriptor* likePropertyDescriptor = likeDescriptor;
        //    1. Assert: LikeDesc is either a Property Descriptor or undefined.
        //    2. ReturnIfAbrupt(Desc).
        //    3. Assert : Desc is a Property Descriptor
        //    4. If LikeDesc is undefined, then set LikeDesc to Record{ [[Value]]: undefined, [[Writable]] : false, [[Get]] : undefined, [[Set]] : undefined, [[Enumerable]] : false, [[Configurable]] : false }.
        if (likePropertyDescriptor == nullptr)
        {
            likePropertyDescriptor = requestContext->GetLibrary()->GetDefaultPropertyDescriptor();
        }
        //    5. If either IsGenericDescriptor(Desc) or IsDataDescriptor(Desc) is true, then
        if (resultDescriptor->IsDataDescriptor() || resultDescriptor->IsGenericDescriptor())
        {
            //    a.If Desc does not have a[[Value]] field, then set Desc.[[Value]] to LikeDesc.[[Value]].
            //    b.If Desc does not have a[[Writable]] field, then set Desc.[[Writable]] to LikeDesc.[[Writable]].
            if (!resultDescriptor->ValueSpecified())
            {
                resultDescriptor->SetValue(likePropertyDescriptor->GetValue());
            }
            if (!resultDescriptor->WritableSpecified())
            {
                resultDescriptor->SetWritable(likePropertyDescriptor->IsWritable());
            }
        }
        else
        {
            //    6. Else,
            //    a.If Desc does not have a[[Get]] field, then set Desc.[[Get]] to LikeDesc.[[Get]].
            //    b.If Desc does not have a[[Set]] field, then set Desc.[[Set]] to LikeDesc.[[Set]].
            if (!resultDescriptor->GetterSpecified())
            {
                resultDescriptor->SetGetter(likePropertyDescriptor->GetGetter());
            }
            if (!resultDescriptor->SetterSpecified())
            {
                resultDescriptor->SetSetter(likePropertyDescriptor->GetSetter());
            }
        }
        //    7. If Desc does not have an[[Enumerable]] field, then set Desc.[[Enumerable]] to LikeDesc.[[Enumerable]].
        //    8. If Desc does not have a[[Configurable]] field, then set Desc.[[Configurable]] to LikeDesc.[[Configurable]].
        //    9. Return Desc.
        if (!resultDescriptor->EnumerableSpecified())
        {
            resultDescriptor->SetEnumerable(likePropertyDescriptor->IsEnumerable());
        }
        if (!resultDescriptor->ConfigurableSpecified())
        {
            resultDescriptor->SetConfigurable(likePropertyDescriptor->IsConfigurable());
        }
    }